

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O3

bool __thiscall
chrono::collision::ChCollisionSystemBullet::RayHit
          (ChCollisionSystemBullet *this,ChVector<double> *from,ChVector<double> *to,
          ChCollisionModel *model,ChRayhitResult *result,short filter_group,short filter_mask)

{
  ChCollisionModel *pCVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  float fVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined8 in_XMM3_Qa;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  cbtAlignedObjectArray<const_cbtCollisionObject_*> local_b8;
  undefined8 local_98;
  float local_90;
  undefined4 local_8c;
  undefined8 local_88;
  ulong uStack_80;
  cbtAlignedObjectArray<cbtVector3> local_78;
  cbtAlignedObjectArray<cbtVector3> local_58;
  cbtAlignedObjectArray<float> local_38;
  
  local_90 = (float)from->m_data[2];
  auVar2 = vcvtpd2ps_avx(*(undefined1 (*) [16])from->m_data);
  local_98 = vmovlps_avx(auVar2);
  auVar2 = vcvtpd2ps_avx(*(undefined1 (*) [16])to->m_data);
  local_b8.m_ownsMemory = true;
  local_b8.m_data = (cbtCollisionObject **)0x0;
  local_b8.m_size = 0;
  local_b8.m_capacity = 0;
  local_88 = vmovlps_avx(auVar2);
  uStack_80 = (ulong)(uint)(float)to->m_data[2];
  local_8c = 0;
  local_78.m_ownsMemory = true;
  local_78.m_data = (cbtVector3 *)0x0;
  local_78.m_size = 0;
  local_78.m_capacity = 0;
  local_58.m_ownsMemory = true;
  local_58.m_data = (cbtVector3 *)0x0;
  local_58.m_size = 0;
  local_58.m_capacity = 0;
  local_38.m_ownsMemory = true;
  local_38.m_data = (float *)0x0;
  local_38.m_size = 0;
  local_38.m_capacity = 0;
  (*this->bt_collision_world->_vptr_cbtCollisionWorld[8])();
  if (0 < (long)local_b8.m_size) {
    fVar7 = 1.0;
    uVar4 = 0xffffffff;
    uVar6 = 0;
    do {
      if ((ChCollisionModel *)local_b8.m_data[uVar6]->m_userObjectPointer == model) {
        if (local_38.m_data[uVar6] < fVar7) {
          uVar4 = uVar6 & 0xffffffff;
          fVar7 = local_38.m_data[uVar6];
        }
      }
      uVar6 = uVar6 + 1;
    } while ((long)local_b8.m_size != uVar6);
    iVar3 = (int)uVar4;
    if (iVar3 != -1) {
      result->hit = true;
      dVar8 = (double)fVar7;
      pCVar1 = (ChCollisionModel *)local_b8.m_data[iVar3]->m_userObjectPointer;
      result->hitModel = pCVar1;
      fVar7 = local_58.m_data[iVar3].m_floats[2];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)local_58.m_data[iVar3].m_floats;
      auVar2 = vcvtps2pd_avx(auVar2);
      *(undefined1 (*) [16])(result->abs_hitPoint).m_data = auVar2;
      (result->abs_hitPoint).m_data[2] = (double)fVar7;
      dVar11 = (double)local_78.m_data[iVar3].m_floats[1];
      auVar10._0_8_ = (double)local_78.m_data[iVar3].m_floats[0];
      auVar10._8_8_ = in_XMM3_Qa;
      auVar12._0_8_ = (double)local_78.m_data[iVar3].m_floats[2];
      auVar12._8_8_ = in_XMM3_Qa;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar11 * dVar11;
      auVar2 = vfmadd231sd_fma(auVar14,auVar10,auVar10);
      auVar2 = vfmadd231sd_fma(auVar2,auVar12,auVar12);
      auVar2 = vsqrtsd_avx(auVar2,auVar2);
      bVar5 = 2.2250738585072014e-308 <= auVar2._0_8_;
      dVar13 = 1.0 / auVar2._0_8_;
      (result->abs_hitNormal).m_data[0] =
           (double)((ulong)bVar5 * (long)(dVar13 * auVar10._0_8_) +
                   (ulong)!bVar5 * 0x3ff0000000000000);
      (result->abs_hitNormal).m_data[1] = (double)((ulong)bVar5 * (long)(dVar13 * dVar11));
      (result->abs_hitNormal).m_data[2] = (double)((ulong)bVar5 * (long)(dVar13 * auVar12._0_8_));
      result->dist_factor = dVar8;
      (*pCVar1->_vptr_ChCollisionModel[0x25])();
      dVar13 = (double)SUB84(dVar8,0);
      dVar8 = (result->abs_hitNormal).m_data[2];
      dVar11 = (result->abs_hitPoint).m_data[2];
      auVar9._0_8_ = dVar13 * (result->abs_hitNormal).m_data[0];
      auVar9._8_8_ = dVar13 * (result->abs_hitNormal).m_data[1];
      auVar2 = vsubpd_avx(*(undefined1 (*) [16])(result->abs_hitPoint).m_data,auVar9);
      *(undefined1 (*) [16])(result->abs_hitPoint).m_data = auVar2;
      (result->abs_hitPoint).m_data[2] = dVar11 - dVar13 * dVar8;
      bVar5 = true;
      goto LAB_007f1596;
    }
  }
  result->hit = false;
  bVar5 = false;
LAB_007f1596:
  cbtAlignedObjectArray<float>::~cbtAlignedObjectArray(&local_38);
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_58);
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_78);
  cbtAlignedObjectArray<const_cbtCollisionObject_*>::~cbtAlignedObjectArray(&local_b8);
  return bVar5;
}

Assistant:

bool ChCollisionSystemBullet::RayHit(const ChVector<>& from,
                                     const ChVector<>& to,
                                     ChCollisionModel* model,
                                     ChRayhitResult& result,
                                     short int filter_group,
                                     short int filter_mask) const {
    cbtVector3 btfrom((cbtScalar)from.x(), (cbtScalar)from.y(), (cbtScalar)from.z());
    cbtVector3 btto((cbtScalar)to.x(), (cbtScalar)to.y(), (cbtScalar)to.z());

    cbtCollisionWorld::AllHitsRayResultCallback rayCallback(btfrom, btto);
    rayCallback.m_collisionFilterGroup = filter_group;
    rayCallback.m_collisionFilterMask = filter_mask;

    this->bt_collision_world->rayTest(btfrom, btto, rayCallback);

    // Find the closest hit result on the specified model (if any)
    int hit = -1;
    cbtScalar fraction = 1;
    for (int i = 0; i < rayCallback.m_collisionObjects.size(); ++i) {
        if (rayCallback.m_collisionObjects[i]->getUserPointer() == model && rayCallback.m_hitFractions[i] < fraction) {
            hit = i;
            fraction = rayCallback.m_hitFractions[i];
        }
    }

    // Ray does not hit specified model
    if (hit == -1) {
        result.hit = false;
        return false;
    }

    // Return the closest hit on the specified model
    result.hit = true;
    result.hitModel = static_cast<ChCollisionModel*>(rayCallback.m_collisionObjects[hit]->getUserPointer());
    result.abs_hitPoint.Set(rayCallback.m_hitPointWorld[hit].x(), rayCallback.m_hitPointWorld[hit].y(),
                            rayCallback.m_hitPointWorld[hit].z());
    result.abs_hitNormal.Set(rayCallback.m_hitNormalWorld[hit].x(), rayCallback.m_hitNormalWorld[hit].y(),
                             rayCallback.m_hitNormalWorld[hit].z());
    result.abs_hitNormal.Normalize();
    result.dist_factor = fraction;
    result.abs_hitPoint = result.abs_hitPoint - result.abs_hitNormal * result.hitModel->GetEnvelope();
    return true;
}